

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

void __thiscall
glslang::TReflectionTraverser::getOffsets
          (TReflectionTraverser *this,TType *type,TVector<int> *offsets)

{
  TVector<int> *parentType;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  const_reference pvVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference pvVar5;
  ulong local_38;
  size_t m;
  int offset;
  int memberSize;
  TTypeList *memberList;
  TVector<int> *offsets_local;
  TType *type_local;
  TReflectionTraverser *this_local;
  
  memberList = (TTypeList *)offsets;
  offsets_local = (TVector<int> *)type;
  type_local = (TType *)this;
  _offset = &TType::getStruct(type)->
             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
  m._4_4_ = 0;
  m._0_4_ = 0;
  for (local_38 = 0;
      sVar3 = std::vector<int,_glslang::pool_allocator<int>_>::size
                        ((vector<int,_glslang::pool_allocator<int>_> *)memberList), local_38 < sVar3
      ; local_38 = local_38 + 1) {
    pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (_offset,local_38);
    iVar2 = (*pvVar4->type->_vptr_TType[10])();
    bVar1 = TQualifier::hasOffset((TQualifier *)CONCAT44(extraout_var,iVar2));
    if (bVar1) {
      pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
               operator[](_offset,local_38);
      iVar2 = (*pvVar4->type->_vptr_TType[10])();
      m._0_4_ = *(int *)(CONCAT44(extraout_var_00,iVar2) + 0x14);
    }
    parentType = offsets_local;
    pvVar4 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::operator[]
                       (_offset,local_38);
    TIntermediate::updateOffset((TType *)parentType,pvVar4->type,(int *)&m,(int *)((long)&m + 4));
    iVar2 = (int)m;
    pvVar5 = std::vector<int,_glslang::pool_allocator<int>_>::operator[]
                       ((vector<int,_glslang::pool_allocator<int>_> *)memberList,local_38);
    *pvVar5 = iVar2;
    m._0_4_ = m._4_4_ + (int)m;
  }
  return;
}

Assistant:

void getOffsets(const TType& type, TVector<int>& offsets)
    {
        const TTypeList& memberList = *type.getStruct();
        int memberSize = 0;
        int offset = 0;

        for (size_t m = 0; m < offsets.size(); ++m) {
            // if the user supplied an offset, snap to it now
            if (memberList[m].type->getQualifier().hasOffset())
                offset = memberList[m].type->getQualifier().layoutOffset;

            // calculate the offset of the next member and align the current offset to this member
            intermediate.updateOffset(type, *memberList[m].type, offset, memberSize);

            // save the offset of this member
            offsets[m] = offset;

            // update for the next member
            offset += memberSize;
        }
    }